

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pio.c
# Opt level: O2

lineiter_t * lineiter_next_plain(lineiter_t *li)

{
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  char *pcVar4;
  int iVar5;
  
  li->lineno = li->lineno + 1;
  pcVar2 = fgets(li->buf,li->bsiz,(FILE *)li->fh);
  if (pcVar2 == (char *)0x0) {
    lineiter_free(li);
    li = (lineiter_t *)0x0;
  }
  else {
    pcVar2 = li->buf;
    sVar3 = strlen(pcVar2);
    iVar1 = (int)sVar3;
    li->len = iVar1;
    iVar5 = li->bsiz;
    if ((iVar5 + -1 <= iVar1) && (pcVar2[iVar1 + -1] != '\n')) {
      while( true ) {
        li->bsiz = iVar5 * 2;
        pcVar2 = (char *)__ckd_realloc__(pcVar2,(long)(iVar5 * 2),
                                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/util/pio.c"
                                         ,0x149);
        li->buf = pcVar2;
        pcVar4 = fgets(pcVar2 + li->len,li->bsiz - li->len,(FILE *)li->fh);
        pcVar2 = li->buf;
        iVar1 = li->len;
        sVar3 = strlen(pcVar2 + iVar1);
        iVar1 = (int)sVar3 + iVar1;
        li->len = iVar1;
        if (pcVar4 == (char *)0x0) break;
        iVar5 = li->bsiz;
        if (iVar1 < iVar5 + -1) {
          return li;
        }
        if (pcVar2[(long)iVar1 + -1] == '\n') {
          return li;
        }
      }
    }
  }
  return li;
}

Assistant:

static lineiter_t *
lineiter_next_plain(lineiter_t *li)
{
    /* We are reading the next line */
    li->lineno++;
    
    /* Read a line and check for EOF. */
    if (fgets(li->buf, li->bsiz, li->fh) == NULL) {
        lineiter_free(li);
        return NULL;
    }
    /* If we managed to read the whole thing, then we are done
     * (this will be by far the most common result). */
    li->len = (int32)strlen(li->buf);
    if (li->len < li->bsiz - 1 || li->buf[li->len - 1] == '\n')
        return li;

    /* Otherwise we have to reallocate and keep going. */
    while (1) {
        li->bsiz *= 2;
        li->buf = (char *)ckd_realloc(li->buf, li->bsiz);
        /* If we get an EOF, we are obviously done. */
        if (fgets(li->buf + li->len, li->bsiz - li->len, li->fh) == NULL) {
            li->len += strlen(li->buf + li->len);
            return li;
        }
        li->len += strlen(li->buf + li->len);
        /* If we managed to read the whole thing, then we are done. */
        if (li->len < li->bsiz - 1 || li->buf[li->len - 1] == '\n')
            return li;
    }

    /* Shouldn't get here. */
    return li;
}